

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityCapabilities.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EntityCapabilities::EntityCapabilities
          (EntityCapabilities *this,KBOOL AmunitionSupply,KBOOL FuelSupply,KBOOL RecoveryService,
          KBOOL RepairService,KBOOL ADSB)

{
  KBOOL ADSB_local;
  KBOOL RepairService_local;
  KBOOL RecoveryService_local;
  KBOOL FuelSupply_local;
  KBOOL AmunitionSupply_local;
  EntityCapabilities *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EntityCapabilities_0032eb58;
  (this->field_0).m_ui16Data = (this->field_0).m_ui16Data & 0x1f;
  (this->field_0).m_ui16Data = (this->field_0).m_ui16Data & 0xfffffffe | (uint)AmunitionSupply;
  (this->field_0).m_ui16Data = (this->field_0).m_ui16Data & 0xfffffffd | (uint)FuelSupply << 1;
  (this->field_0).m_ui16Data = (this->field_0).m_ui16Data & 0xfffffffb | (uint)RecoveryService << 2;
  (this->field_0).m_ui16Data = (this->field_0).m_ui16Data & 0xfffffff7 | (uint)RepairService << 3;
  (this->field_0).m_ui16Data = (this->field_0).m_ui16Data & 0xffffffef | (uint)ADSB << 4;
  return;
}

Assistant:

EntityCapabilities::EntityCapabilities( KBOOL AmunitionSupply, KBOOL FuelSupply, KBOOL RecoveryService, KBOOL RepairService, KBOOL ADSB )
{
    m_Unused = 0;
    m_AmmunitionSupply = AmunitionSupply;
    m_FuelSupply = FuelSupply;
    m_RecoveryService = RecoveryService;
    m_RepairService = RepairService;
	m_ADSB = ADSB;
}